

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_serializer.cxx
# Opt level: O1

void __thiscall nuraft::buffer_serializer::put_u32(buffer_serializer *this,uint32_t val)

{
  size_t sVar1;
  byte bVar2;
  size_t sVar3;
  byte *pbVar4;
  overflow_error *this_00;
  byte bVar5;
  byte bVar6;
  
  sVar1 = this->pos_;
  sVar3 = buffer::size(this->buf_);
  if (sVar1 + 4 <= sVar3) {
    pbVar4 = buffer::data_begin(this->buf_);
    sVar1 = this->pos_;
    bVar6 = (byte)(val >> 8);
    bVar5 = (byte)(val >> 0x18);
    bVar2 = (byte)(val >> 0x10);
    if (this->endian_ == LITTLE) {
      pbVar4[sVar1] = (byte)val;
      pbVar4[sVar1 + 1] = bVar6;
      pbVar4[sVar1 + 2] = bVar2;
      pbVar4[sVar1 + 3] = bVar5;
    }
    else {
      pbVar4[sVar1 + 3] = (byte)val;
      pbVar4[sVar1 + 2] = bVar6;
      pbVar4[sVar1 + 1] = bVar2;
      pbVar4[sVar1] = bVar5;
    }
    pos(this,this->pos_ + 4);
    return;
  }
  this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
  std::overflow_error::overflow_error(this_00,"not enough space");
  __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
}

Assistant:

void buffer_serializer::put_u32(uint32_t val) {
    chk_length(val);
    uint8_t* ptr = buf_.data_begin() + pos_;
    if (endian_ == LITTLE)  { put32l(val, ptr); }
    else                    { put32b(val, ptr); }
    pos( pos() + sizeof(val) );
}